

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall libcellml::Model::doAddComponent(Model *this,ComponentPtr *component)

{
  _func_int **pp_Var1;
  bool bVar2;
  ComponentImpl *this_00;
  shared_ptr<libcellml::Model> thisModel;
  ParentedEntity local_58;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_48;
  ParentedEntity local_38;
  
  std::__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  bVar2 = ParentedEntity::hasParent
                    ((ParentedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (bVar2) {
    ParentedEntity::parent(&local_58);
    pp_Var1 = local_58.super_Entity._vptr_Entity;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.super_Entity.mPimpl);
    if (local_48._M_ptr != (element_type *)pp_Var1) {
      ParentedEntity::parent(&local_38);
      local_58.super_Entity._vptr_Entity = local_38.super_Entity._vptr_Entity;
      local_58.super_Entity.mPimpl = local_38.super_Entity.mPimpl;
      local_38.super_Entity._vptr_Entity = (_func_int **)0x0;
      local_38.super_Entity.mPimpl = (EntityImpl *)0x0;
      removeComponentFromEntity((EntityPtr *)&local_58,component);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.super_Entity.mPimpl);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.super_Entity.mPimpl);
    }
  }
  this_00 = Component::pFunc((component->
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
  std::__shared_ptr<libcellml::ParentedEntity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::ParentedEntity,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &local_48);
  ParentedEntity::ParentedEntityImpl::setParent
            ((ParentedEntityImpl *)this_00,(ParentedEntityPtr *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.super_Entity.mPimpl);
  bVar2 = ComponentEntity::doAddComponent(&this->super_ComponentEntity,component);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return bVar2;
}

Assistant:

bool Model::doAddComponent(const ComponentPtr &component)
{
    auto thisModel = shared_from_this();
    if (component->hasParent() && (thisModel != component->parent())) {
        removeComponentFromEntity(component->parent(), component);
    }
    component->pFunc()->setParent(thisModel);

    return ComponentEntity::doAddComponent(component);
}